

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::eachScene(Map *this,function<void_(Scene_*)> *fn)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  std::operator<<((ostream *)&std::cout,"class:Map method:eachScene\n");
  ppSVar1 = (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppSVar2 != ppSVar1; ppSVar2 = ppSVar2 + 1) {
    std::function<void_(Scene_*)>::operator()(fn,*ppSVar2);
  }
  return;
}

Assistant:

void Map::eachScene(std::function<void(Scene *)> fn) {
    std::cout << "class:Map method:eachScene\n";
    for (auto i : scenes) {
        fn(i);
    }
}